

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<chatra::Node> __thiscall
chatra::
parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          first,__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                last)

{
  Token *pTVar1;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  __first;
  pointer psVar2;
  bool bVar3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  reference pOVar6;
  ulong uVar7;
  iterator __first_00;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  element_type *peVar9;
  reference ppTVar10;
  size_type sVar11;
  reference ppTVar12;
  reference pvVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  in_R8;
  shared_ptr<chatra::Node> sVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  allocator local_269;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  allocator local_229;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  allocator local_1e9;
  string local_1e8;
  shared_ptr<chatra::Node> *local_1c8;
  const_iterator local_1c0;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_1b8;
  shared_ptr<chatra::Node> *local_1b0;
  const_iterator local_1a8;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_1a0;
  const_iterator local_198;
  shared_ptr<chatra::Node> *local_190;
  shared_ptr<chatra::Node> *local_188;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_180;
  undefined1 local_178 [8];
  shared_ptr<chatra::Node> n_1;
  OperatorPattern *pattern_1;
  iterator __end5_1;
  iterator __begin5_1;
  vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_> *__range5_1;
  iterator iStack_130;
  bool matched_1;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_128;
  iterator it_1;
  const_iterator local_118;
  shared_ptr<chatra::Node> *local_110;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_108;
  const_iterator local_100;
  const_iterator local_f8;
  shared_ptr<chatra::Node> *local_f0;
  shared_ptr<chatra::Node> *local_e8;
  shared_ptr<chatra::Node> *local_e0;
  undefined1 local_d8 [8];
  shared_ptr<chatra::Node> n;
  OperatorPattern *pattern;
  iterator __end5;
  iterator __begin5;
  vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_> *__range5;
  iterator iStack_90;
  bool matched;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_88;
  iterator it;
  OperatorPatternGroup *group;
  iterator __end2;
  iterator __begin2;
  vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_> *__range2;
  undefined1 local_40 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> nodes;
  ParserContext *ct_local;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last_local;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  first_local;
  
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ct;
  last_local = first;
  parseNodes<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
            ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)local_40,(chatra *)ct,(ParserContext *)first._M_current,last,in_R8);
  bVar3 = std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          empty((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)local_40);
  if (bVar3) {
    ppTVar10 = __gnu_cxx::
               __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
               ::operator*(&last_local);
    createNullNode(this,*ppTVar10);
  }
  else {
    __end2 = std::
             vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>::
             begin((vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>
                    *)opPatterns);
    group = (OperatorPatternGroup *)
            std::vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>
            ::end((vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>
                   *)opPatterns);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<chatra::OperatorPatternGroup_*,_std::vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>_>
                                       *)&group), bVar3) {
      it._M_current =
           (shared_ptr<chatra::Node> *)
           __gnu_cxx::
           __normal_iterator<chatra::OperatorPatternGroup_*,_std::vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>_>
           ::operator*(&__end2);
      if ((((reference)it._M_current)->leftToRight & 1U) == 0) {
        local_128._M_current =
             (shared_ptr<chatra::Node> *)
             std::
             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ::end((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    *)local_40);
        while( true ) {
          iStack_130 = std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                *)local_40);
          bVar3 = __gnu_cxx::operator!=(&local_128,&stack0xfffffffffffffed0);
          if (!bVar3) break;
          bVar3 = false;
          p_Var5 = &((it._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount;
          __end5_1 = std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>
                     ::begin((vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>
                              *)p_Var5);
          pattern_1 = (OperatorPattern *)
                      std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>
                      ::end((vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>
                             *)p_Var5);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5_1,
                                    (__normal_iterator<chatra::OperatorPattern_*,_std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>_>
                                     *)&pattern_1), bVar4) {
            pOVar6 = __gnu_cxx::
                     __normal_iterator<chatra::OperatorPattern_*,_std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>_>
                     ::operator*(&__end5_1);
            __first_00 = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)local_40);
            n_1.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current;
            uVar7 = std::
                    distance<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                              ((__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                )__first_00._M_current,local_128);
            sVar11 = std::
                     vector<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                     ::size(&pOVar6->elements);
            if (sVar11 <= uVar7) {
              local_180._M_current =
                   (shared_ptr<chatra::Node> *)
                   std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)local_40);
              sVar11 = std::
                       vector<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                       ::size(&pOVar6->elements);
              local_188 = (shared_ptr<chatra::Node> *)
                          __gnu_cxx::
                          __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          ::operator-(&local_128,sVar11);
              extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                        ((chatra *)local_178,local_180,
                         (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          )local_188,pOVar6);
              bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_178);
              if (bVar4) {
                sVar11 = std::
                         vector<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                         ::size(&pOVar6->elements);
                local_1a0 = __gnu_cxx::
                            __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                            ::operator-(&local_128,sVar11);
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                          ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            *)&local_198,&local_1a0);
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                          ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            *)&local_1a8,&local_128);
                local_190 = (shared_ptr<chatra::Node> *)
                            std::
                            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                     *)local_40,local_198,local_1a8);
                local_128._M_current = local_190;
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                          ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            *)&local_1c0,&local_128);
                local_1b8._M_current =
                     (shared_ptr<chatra::Node> *)
                     std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               *)local_40,local_1c0,(value_type *)local_178);
                local_1b0 = (shared_ptr<chatra::Node> *)
                            __gnu_cxx::
                            __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                            ::operator+(&local_1b8,1);
                bVar3 = true;
                local_128 = (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                             )local_1b0;
              }
              std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)local_178);
            }
            __gnu_cxx::
            __normal_iterator<chatra::OperatorPattern_*,_std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>_>
            ::operator++(&__end5_1);
          }
          if (!bVar3) {
            local_1c8 = (shared_ptr<chatra::Node> *)
                        __gnu_cxx::
                        __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                        ::operator--(&local_128,0);
          }
        }
      }
      else {
        local_88._M_current =
             (shared_ptr<chatra::Node> *)
             std::
             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      *)local_40);
        while( true ) {
          iStack_90 = std::
                      vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ::end((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)local_40);
          bVar3 = __gnu_cxx::operator!=(&local_88,&stack0xffffffffffffff70);
          if (!bVar3) break;
          bVar3 = false;
          p_Var5 = &((it._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount;
          __end5 = std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>::
                   begin((vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>
                          *)p_Var5);
          pattern = (OperatorPattern *)
                    std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>::
                    end((vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_> *
                        )p_Var5);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<chatra::OperatorPattern_*,_std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>_>
                                             *)&pattern), bVar4) {
            pOVar6 = __gnu_cxx::
                     __normal_iterator<chatra::OperatorPattern_*,_std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>_>
                     ::operator*(&__end5);
            __first._M_current = local_88._M_current;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::end((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        *)local_40);
            uVar7 = std::
                    distance<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                              (__first,(__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                        )n.
                                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
            sVar11 = std::
                     vector<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                     ::size(&pOVar6->elements);
            if (sVar11 <= uVar7) {
              local_e0 = (shared_ptr<chatra::Node> *)
                         std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)local_40);
              local_e8 = local_88._M_current;
              extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                        ((chatra *)local_d8,
                         (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          )local_e0,local_88,pOVar6);
              bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
              if (bVar4) {
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                          ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            *)&local_f8,&local_88);
                sVar11 = std::
                         vector<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                         ::size(&pOVar6->elements);
                local_108 = __gnu_cxx::
                            __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                            ::operator+(&local_88,sVar11);
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                          ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            *)&local_100,&local_108);
                local_f0 = (shared_ptr<chatra::Node> *)
                           std::
                           vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                    *)local_40,local_f8,local_100);
                local_88._M_current = local_f0;
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                          ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            *)&local_118,&local_88);
                local_110 = (shared_ptr<chatra::Node> *)
                            std::
                            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                      *)local_40,local_118,(value_type *)local_d8);
                bVar3 = true;
                local_88._M_current = local_110;
              }
              std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)local_d8);
            }
            __gnu_cxx::
            __normal_iterator<chatra::OperatorPattern_*,_std::vector<chatra::OperatorPattern,_std::allocator<chatra::OperatorPattern>_>_>
            ::operator++(&__end5);
          }
          if (!bVar3) {
            it_1._M_current =
                 (shared_ptr<chatra::Node> *)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                 ::operator++(&local_88,0);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<chatra::OperatorPatternGroup_*,_std::vector<chatra::OperatorPatternGroup,_std::allocator<chatra::OperatorPatternGroup>_>_>
      ::operator++(&__end2);
    }
    bVar3 = std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            empty((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)local_40);
    if (!bVar3) {
      p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::
               vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)local_40,0);
      peVar9 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var8);
      if (peVar9->type != Unknown) {
        sVar11 = std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::size((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         *)local_40);
        if (sVar11 == 1) {
          pvVar13 = std::
                    vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)local_40,0);
          std::shared_ptr<chatra::Node>::shared_ptr((shared_ptr<chatra::Node> *)this,pvVar13);
        }
        else {
          p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 *)local_40,1);
          peVar9 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var8);
          bVar3 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::empty
                            (&peVar9->tokens);
          psVar2 = nodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar3) {
            ppTVar10 = __gnu_cxx::
                       __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                       ::operator*(&last_local);
            pTVar1 = *ppTVar10;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_268,"extra token in expression starts from this token",
                       &local_269);
            local_288.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_288.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_288.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_288);
            ParserContext::errorAtToken((ParserContext *)psVar2,Error,pTVar1,&local_268,&local_288);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_288);
            std::__cxx11::string::~string((string *)&local_268);
            std::allocator<char>::~allocator((allocator<char> *)&local_269);
          }
          else {
            p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   *)local_40,1);
            peVar9 = std::
                     __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var8);
            ppTVar12 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::
                       operator[](&peVar9->tokens,0);
            pTVar1 = *ppTVar12;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_228,"extra token in expression",&local_229);
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_248);
            ParserContext::errorAtToken((ParserContext *)psVar2,Error,pTVar1,&local_228,&local_248);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_248);
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator((allocator<char> *)&local_229);
          }
          ppTVar10 = __gnu_cxx::
                     __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                     ::operator*(&last_local);
          createNullNode(this,*ppTVar10);
        }
        goto LAB_0028958f;
      }
    }
    psVar2 = nodes.
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppTVar10 = __gnu_cxx::
               __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
               ::operator*(&last_local);
    pTVar1 = *ppTVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"expected expression",&local_1e9);
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_208);
    ParserContext::errorAtToken((ParserContext *)psVar2,Error,pTVar1,&local_1e8,&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    ppTVar10 = __gnu_cxx::
               __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
               ::operator*(&last_local);
    createNullNode(this,*ppTVar10);
  }
LAB_0028958f:
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          local_40);
  sVar14.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar14.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar14.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseExpression(ParserContext& ct, TokenPtrIterator first, TokenPtrIterator last) {

	auto nodes = parseNodes(ct, first, last);
	if (nodes.empty())
		return createNullNode(**first);

	// Simple but may inefficient bottom-up parsing
	// TODO rewrite
	for (auto& group : opPatterns) {
		if (group.leftToRight) {
			for (auto it = nodes.begin(); it != nodes.end(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(it, nodes.end())) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it, pattern);
					if (!n)
						continue;
					it = nodes.erase(it, it + pattern.elements.size());
					it = nodes.insert(it, n);
					matched = true;
				}
				if (!matched)
					it++;
			}
		}
		else {
			for (auto it = nodes.end(); it != nodes.begin(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(nodes.begin(), it)) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it - pattern.elements.size(), pattern);
					if (!n)
						continue;
					it = nodes.erase(it - pattern.elements.size(), it);
					it = nodes.insert(it, n) + 1;
					matched = true;
				}
				if (!matched)
					it--;
			}
		}
	}

	if (nodes.empty() || nodes[0]->type == NodeType::Unknown) {
		ct.errorAtToken(ErrorLevel::Error, **first, "expected expression", {});
		return createNullNode(**first);
	}

	if (nodes.size() != 1) {
		if (!nodes[1]->tokens.empty())
			ct.errorAtToken(ErrorLevel::Error, *nodes[1]->tokens[0], "extra token in expression", {});
		else
			ct.errorAtToken(ErrorLevel::Error, **first, "extra token in expression starts from this token", {});
		return createNullNode(**first);
	}

	return nodes[0];
}